

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

string * SettingName(string *__return_storage_ptr__,string *arg)

{
  long in_FS_OFFSET;
  
  if ((arg->_M_string_length == 0) || (*(arg->_M_dataplus)._M_p != '-')) {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) goto LAB_0012ae67;
    std::__cxx11::string::string((string *)__return_storage_ptr__,arg);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
LAB_0012ae67:
      __stack_chk_fail();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,arg,1,0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string SettingName(const std::string& arg)
{
    return arg.size() > 0 && arg[0] == '-' ? arg.substr(1) : arg;
}